

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableType.hpp
# Opt level: O2

bool __thiscall rsg::VariableType::Member::operator!=(Member *this,Member *other)

{
  VariableType *this_00;
  bool bVar1;
  bool bVar2;
  
  bVar1 = std::operator!=(&this->m_name,&other->m_name);
  bVar2 = true;
  if (!bVar1) {
    this_00 = this->m_type;
    if ((this_00 != (VariableType *)0x0) != (other->m_type == (VariableType *)0x0)) {
      if ((this_00 != (VariableType *)0x0) &&
         (bVar1 = VariableType::operator!=(this_00,other->m_type), bVar1)) {
        return true;
      }
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool operator!= (const Member& other) const
		{
			if (m_name != other.m_name)
				return true;
			if (!!m_type != !!other.m_type)
				return true;
			if (m_type && *m_type != *other.m_type)
				return true;
			return false;
		}